

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verbose.c
# Opt level: O2

void print_conflicts(int state)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  action *paVar4;
  int iVar5;
  
  paVar4 = (action *)(parser + state);
  iVar1 = -1;
  iVar3 = -1;
  uVar2 = 0xffffffff;
LAB_0011776c:
  iVar5 = iVar1;
  do {
    while( true ) {
      do {
        do {
          paVar4 = paVar4->next;
          if (paVar4 == (action *)0x0) {
            return;
          }
        } while (paVar4->suppressed == '\x02');
        iVar1 = paVar4->symbol;
        if (iVar1 != iVar5) {
          uVar2 = (ulong)(uint)paVar4->number;
          iVar3 = (paVar4->action_code != '\x01') + 1;
          goto LAB_0011776c;
        }
      } while (paVar4->suppressed != '\x01');
      if ((final_state == state) && (iVar5 == 0)) break;
      if (iVar3 == 1) {
        fprintf((FILE *)verbose_file,"%d: shift/reduce conflict (shift %d, reduce %d) on %s\n",state
                ,uVar2,(ulong)(paVar4->number - 2),symbol_name[iVar5]);
        iVar3 = 1;
      }
      else {
        fprintf((FILE *)verbose_file,"%d: reduce/reduce conflict (reduce %d, reduce %d) on %s\n",
                state,(ulong)((int)uVar2 - 2),(ulong)(paVar4->number - 2),symbol_name[iVar5]);
      }
    }
    iVar5 = 0;
    fprintf((FILE *)verbose_file,"%d: shift/reduce conflict (accept, reduce %d) on $end\n",state,
            (ulong)(paVar4->number - 2));
  } while( true );
}

Assistant:

void print_conflicts(int state)
{
    register int symbol, act, number;
    register action *p;

    symbol = act = number = -1;
    for (p = parser[state]; p; p = p->next)
    {
	if (p->suppressed == 2)
	    continue;

	if (p->symbol != symbol)
	{
	    symbol = p->symbol;
	    number = p->number;
	    if (p->action_code == SHIFT)
		act = SHIFT;
	    else
		act = REDUCE;
	}
	else if (p->suppressed == 1)
	{
	    if (state == final_state && symbol == 0)
	    {
		fprintf(verbose_file, "%d: shift/reduce conflict "
			"(accept, reduce %d) on $end\n", state, p->number - 2);
	    }
	    else
	    {
		if (act == SHIFT)
		{
		    fprintf(verbose_file, "%d: shift/reduce conflict "
			    "(shift %d, reduce %d) on %s\n", state, number,
			    p->number - 2, symbol_name[symbol]);
		}
		else
		{
		    fprintf(verbose_file, "%d: reduce/reduce conflict "
			    "(reduce %d, reduce %d) on %s\n", state,
			    number - 2, p->number - 2, symbol_name[symbol]);
		}
	    }
	}
    }
}